

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  undefined4 in_EAX;
  int iVar6;
  shared_container_t *sc;
  run_container_t *prVar7;
  ushort uVar8;
  void **ppvVar9;
  run_container_t *prVar10;
  uint i;
  uint uVar11;
  uint8_t newtypecode;
  undefined4 uStack_38;
  int local_34;
  
  iVar6 = (r->high_low_container).size;
  if ((long)iVar6 == 0) {
LAB_001040aa:
    i = iVar6 - 1;
  }
  else {
    puVar3 = (r->high_low_container).keys;
    uVar8 = (ushort)(val >> 0x10);
    if (puVar3[(long)iVar6 + -1] == uVar8) goto LAB_001040aa;
    uVar11 = 0;
    if (iVar6 < 1) goto LAB_00104213;
    iVar6 = iVar6 + -1;
    do {
      i = iVar6 + uVar11 >> 1;
      uVar2 = *(ushort *)((long)puVar3 + (ulong)(iVar6 + uVar11 & 0xfffffffe));
      if (uVar2 < uVar8) {
        uVar11 = i + 1;
      }
      else {
        if (uVar2 <= uVar8) goto LAB_001040b6;
        iVar6 = i - 1;
      }
    } while ((int)uVar11 <= iVar6);
    i = ~uVar11;
  }
  if ((int)i < 0) {
    uVar11 = 0;
  }
  else {
LAB_001040b6:
    ppvVar9 = (r->high_low_container).containers;
    puVar4 = (r->high_low_container).typecodes;
    uVar11 = i & 0xffff;
    sc = (shared_container_t *)ppvVar9[uVar11];
    uStack_38 = in_EAX;
    if (puVar4[uVar11] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar11);
      ppvVar9 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar9 + (ulong)(uVar11 * 8)) = sc;
    uVar1 = (r->high_low_container).typecodes[uVar11];
    prVar10 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
    prVar7 = prVar10;
    uVar5 = uVar1;
    if (uVar1 == '\x04') {
      uVar5 = *(uint8_t *)&prVar10->runs;
      prVar7 = *(run_container_t **)prVar10;
    }
    if (uVar5 == '\x03') {
      iVar6 = run_container_cardinality(prVar7);
    }
    else {
      iVar6 = prVar7->n_runs;
    }
    uStack_38 = CONCAT13(uVar1,(undefined3)uStack_38);
    _uStack_38 = CONCAT44(iVar6,uStack_38);
    prVar7 = (run_container_t *)
             container_remove(prVar10,(uint16_t)val,uVar1,(uint8_t *)((long)&uStack_38 + 3));
    if (prVar7 == prVar10) {
      uVar1 = uStack_38._3_1_;
    }
    else {
      container_free(prVar10,uVar1);
      (r->high_low_container).containers[i] = prVar7;
      (r->high_low_container).typecodes[i] = uStack_38._3_1_;
      uVar1 = uStack_38._3_1_;
    }
    prVar10 = prVar7;
    uVar5 = uVar1;
    if (uVar1 == '\x04') {
      uVar5 = *(uint8_t *)&prVar7->runs;
      prVar10 = *(run_container_t **)prVar7;
    }
    if (uVar5 == '\x03') {
      iVar6 = run_container_cardinality(prVar10);
    }
    else {
      iVar6 = prVar10->n_runs;
    }
    if (iVar6 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      (r->high_low_container).containers[i] = prVar7;
      (r->high_low_container).typecodes[i] = uVar1;
    }
    uVar11 = (uint)(local_34 != iVar6);
  }
LAB_00104213:
  return SUB41(uVar11,0);
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}